

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

void xc_available_functional_names(char **list)

{
  int iVar1;
  void *__base;
  long in_RDI;
  int *idlist;
  int N;
  int ii;
  int local_c;
  
  iVar1 = xc_number_of_functionals();
  __base = malloc((long)iVar1 << 2);
  for (local_c = 0; local_c < iVar1; local_c = local_c + 1) {
    *(int *)((long)__base + (long)local_c * 4) = local_c;
  }
  qsort(__base,(long)iVar1,4,compare_func_names);
  for (local_c = 0; local_c < iVar1; local_c = local_c + 1) {
    strcpy(*(char **)(in_RDI + (long)local_c * 8),
           xc_functional_keys[*(int *)((long)__base + (long)local_c * 4)].name);
  }
  libxc_free((void *)0x159506);
  return;
}

Assistant:

void xc_available_functional_names(char **list)
{
  int ii, N;
  int *idlist;

  /* Arrange list of functional IDs by name */
  N=xc_number_of_functionals();
  idlist=(int *) libxc_malloc(N*sizeof(int));
  for(ii=0;ii<N;ii++) {
    idlist[ii]=ii;
  }
  qsort(idlist, N, sizeof(int), compare_func_names);

  /* Now store the correctly ordered output */
  for(ii=0;ii<N;ii++) {
    strcpy(list[ii],xc_functional_keys[idlist[ii]].name);
  }

  /* Deallocate work array */
  libxc_free(idlist);
}